

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O0

EGLConfig deqp::egl::Image::chooseConfig(Library *egl,EGLDisplay display,ApiType apiType)

{
  EGLenum EVar1;
  value_type pvVar2;
  bool bVar3;
  EGLint EVar4;
  mapped_type_conflict *pmVar5;
  EGLenum *pEVar6;
  reference ppvVar7;
  NotSupportedError *this;
  vector<void_*,_std::allocator<void_*>_> local_a0;
  key_type_conflict local_88;
  int local_84;
  key_type_conflict local_80;
  int ndx;
  deUint32 local_6c;
  undefined1 local_68 [8];
  vector<void_*,_std::allocator<void_*>_> configs;
  AttribMap attribs;
  EGLDisplay display_local;
  Library *egl_local;
  ApiType apiType_local;
  
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_68);
  local_6c = apiType.m_bits;
  EVar4 = eglu::apiRenderableType(apiType);
  local_80 = 0x3040;
  pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,&local_80);
  *pmVar5 = EVar4;
  local_84 = 0;
  while( true ) {
    if (2 < local_84) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"No compatible EGL configs found",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                 ,0xf0);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
      ;
    }
    EVar1 = chooseConfig::s_surfaceTypes[local_84];
    local_88 = 0x3033;
    pEVar6 = (EGLenum *)
             std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,&local_88);
    *pEVar6 = EVar1;
    eglu::chooseConfigs(&local_a0,egl,display,
                        (AttribMap *)
                        &configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    std::vector<void_*,_std::allocator<void_*>_>::operator=
              ((vector<void_*,_std::allocator<void_*>_> *)local_68,&local_a0);
    std::vector<void_*,_std::allocator<void_*>_>::~vector(&local_a0);
    bVar3 = std::vector<void_*,_std::allocator<void_*>_>::empty
                      ((vector<void_*,_std::allocator<void_*>_> *)local_68);
    if (!bVar3) break;
    local_84 = local_84 + 1;
  }
  ppvVar7 = std::vector<void_*,_std::allocator<void_*>_>::front
                      ((vector<void_*,_std::allocator<void_*>_> *)local_68);
  pvVar2 = *ppvVar7;
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_68);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return pvVar2;
}

Assistant:

EGLConfig chooseConfig (const Library& egl, EGLDisplay display, ApiType apiType)
{
	AttribMap				attribs;
	vector<EGLConfig>		configs;
	// Prefer configs in order: pbuffer, window, pixmap
	static const EGLenum	s_surfaceTypes[] = { EGL_PBUFFER_BIT, EGL_WINDOW_BIT, EGL_PIXMAP_BIT };

	attribs[EGL_RENDERABLE_TYPE] = eglu::apiRenderableType(apiType);

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_surfaceTypes); ++ndx)
	{
		attribs[EGL_SURFACE_TYPE] = s_surfaceTypes[ndx];
		configs = eglu::chooseConfigs(egl, display, attribs);

		if (!configs.empty())
			return configs.front();
	}

	TCU_THROW(NotSupportedError, "No compatible EGL configs found");
	return (EGLConfig)0;
}